

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk7c(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  envy_bios_power_unk7c_entry *peVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = (bios->power).unk7c.offset;
  iVar9 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).unk7c.version = bios->data[uVar6];
    }
    else {
      (bios->power).unk7c.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk7c.version == '\x10') {
      uVar6 = (bios->power).unk7c.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).unk7c.hlen = bios->data[uVar6];
        iVar9 = 0;
      }
      else {
        (bios->power).unk7c.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar6 = (bios->power).unk7c.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).unk7c.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).unk7c.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).unk7c.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).unk7c.entriesnum = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).unk7c.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).unk7c.valid = (iVar7 == 0 && iVar9 == 0) && iVar3 == 0;
      bVar1 = (bios->power).unk7c.entriesnum;
      peVar4 = (envy_bios_power_unk7c_entry *)malloc((ulong)((uint)bVar1 * 4));
      (bios->power).unk7c.entries = peVar4;
      if (bVar1 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = (uint)(bios->power).unk7c.hlen + (bios->power).unk7c.offset;
        bVar2 = (bios->power).unk7c.rlen;
        iVar9 = 0;
        uVar8 = 0;
        do {
          peVar4[uVar8].offset = uVar5;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + bVar2;
        } while (bVar1 != uVar8);
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n");
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_unk7c(struct envy_bios *bios) {
	struct envy_bios_power_unk7c *unk7c = &bios->power.unk7c;
	int i, err = 0;

	if (!unk7c->offset)
		return -EINVAL;

	bios_u8(bios, unk7c->offset + 0x0, &unk7c->version);
	switch(unk7c->version) {
	case 0x10:
		err |= bios_u8(bios, unk7c->offset + 0x1, &unk7c->hlen);
		err |= bios_u8(bios, unk7c->offset + 0x2, &unk7c->rlen);
		err |= bios_u8(bios, unk7c->offset + 0x3, &unk7c->entriesnum);
		unk7c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PCIe-PLATFORM table version 0x%x\n", unk7c->version);
		return -EINVAL;
	};

	err = 0;
	unk7c->entries = malloc(unk7c->entriesnum * sizeof(struct envy_bios_power_unk7c_entry));
	for (i = 0; i < unk7c->entriesnum; i++) {
		uint32_t data = unk7c->offset + unk7c->hlen + i * unk7c->rlen;

		unk7c->entries[i].offset = data;
	}

	return 0;
}